

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartDTDEntity(xmlTextWriterPtr writer,int pe,xmlChar *name)

{
  int iVar1;
  xmlLinkPtr lk_00;
  void *pvVar2;
  long *data;
  xmlChar *pxVar3;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *name_local;
  int pe_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer != (xmlTextWriterPtr)0x0) && (name != (xmlChar *)0x0)) && (*name != '\0')) {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (((lk_00 != (xmlLinkPtr)0x0) && (pvVar2 = xmlLinkGetData(lk_00), pvVar2 != (void *)0x0)) &&
       (iVar1 = *(int *)((long)pvVar2 + 8), iVar1 != 0)) {
      if (iVar1 == 7) {
        lk._0_4_ = xmlOutputBufferWriteString(writer->out," [");
        if ((int)lk < 0) {
          return -1;
        }
        if (writer->indent != 0) {
          iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
          if (iVar1 < 0) {
            return -1;
          }
          lk._0_4_ = iVar1 + (int)lk;
        }
        *(undefined4 *)((long)pvVar2 + 8) = 8;
      }
      else if (iVar1 != 8) {
        return -1;
      }
    }
    data = (long *)(*xmlMalloc)(0x10);
    if (data == (long *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDElement : out of memory!\n");
      writer_local._4_4_ = -1;
    }
    else {
      pxVar3 = xmlStrdup(name);
      *data = (long)pxVar3;
      if (*data == 0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDElement : out of memory!\n");
        (*xmlFree)(data);
        writer_local._4_4_ = -1;
      }
      else {
        if (pe == 0) {
          *(undefined4 *)(data + 1) = 0xd;
        }
        else {
          *(undefined4 *)(data + 1) = 0xf;
        }
        xmlListPushFront(writer->nodes,data);
        if (writer->indent != 0) {
          iVar1 = xmlTextWriterWriteIndent(writer);
          if (iVar1 < 0) {
            return -1;
          }
          lk._0_4_ = iVar1 + (int)lk;
        }
        iVar1 = xmlOutputBufferWriteString(writer->out,"<!ENTITY ");
        if (iVar1 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          lk._0_4_ = iVar1 + (int)lk;
          if (pe != 0) {
            iVar1 = xmlOutputBufferWriteString(writer->out,"% ");
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          iVar1 = xmlOutputBufferWriteString(writer->out,(char *)name);
          if (iVar1 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            writer_local._4_4_ = iVar1 + (int)lk;
          }
        }
      }
    }
    return writer_local._4_4_;
  }
  return -1;
}

Assistant:

int
xmlTextWriterStartDTDEntity(xmlTextWriterPtr writer,
                            int pe, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {

        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_DTD:
                    count = xmlOutputBufferWriteString(writer->out, " [");
                    if (count < 0)
                        return -1;
                    sum += count;
                    if (writer->indent) {
                        count =
                            xmlOutputBufferWriteString(writer->out, "\n");
                        if (count < 0)
                            return -1;
                        sum += count;
                    }
                    p->state = XML_TEXTWRITER_DTD_TEXT;
                    /* fallthrough */
                case XML_TEXTWRITER_DTD_TEXT:
                case XML_TEXTWRITER_NONE:
                    break;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDElement : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDElement : out of memory!\n");
        xmlFree(p);
        return -1;
    }

    if (pe != 0)
        p->state = XML_TEXTWRITER_DTD_PENT;
    else
        p->state = XML_TEXTWRITER_DTD_ENTY;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!ENTITY ");
    if (count < 0)
        return -1;
    sum += count;

    if (pe != 0) {
        count = xmlOutputBufferWriteString(writer->out, "% ");
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}